

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_address.cpp
# Opt level: O0

int __thiscall zmq::ipc_address_t::to_string(ipc_address_t *this,string *addr_)

{
  size_t __n;
  char *in_RSI;
  short *in_RDI;
  size_t src_len;
  char *src_pos;
  char *pos;
  char buf [115];
  char prefix [7];
  short *local_a8;
  undefined1 *local_a0;
  undefined4 local_98;
  undefined2 local_94;
  undefined1 local_92;
  undefined1 auStack_91 [114];
  undefined4 local_1f;
  undefined2 local_1b;
  undefined1 local_19;
  char *local_18;
  int local_4;
  
  if (*in_RDI == 1) {
    local_1f = 0x3a637069;
    local_1b = 0x2f2f;
    local_19 = 0;
    local_98 = 0x3a637069;
    local_94 = 0x2f2f;
    local_a0 = &local_92;
    local_a8 = in_RDI + 1;
    if (((char)in_RDI[1] == '\0') && (*(char *)((long)in_RDI + 3) != '\0')) {
      local_a0 = auStack_91;
      local_92 = 0x40;
      local_a8 = (short *)((long)in_RDI + 3);
    }
    local_18 = in_RSI;
    __n = strnlen((char *)local_a8,
                  ((ulong)*(uint *)(in_RDI + 0x38) - 2) - ((long)local_a8 - (long)(in_RDI + 1)));
    memcpy(local_a0,local_a8,__n);
    std::__cxx11::string::assign(local_18,(ulong)&local_98);
    local_4 = 0;
  }
  else {
    std::__cxx11::string::clear();
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::ipc_address_t::to_string (std::string &addr_) const
{
    if (_address.sun_family != AF_UNIX) {
        addr_.clear ();
        return -1;
    }

    const char prefix[] = "ipc://";
    char buf[sizeof prefix + sizeof _address.sun_path];
    char *pos = buf;
    memcpy (pos, prefix, sizeof prefix - 1);
    pos += sizeof prefix - 1;
    const char *src_pos = _address.sun_path;
    if (!_address.sun_path[0] && _address.sun_path[1]) {
        *pos++ = '@';
        src_pos++;
    }
    // according to http://man7.org/linux/man-pages/man7/unix.7.html, NOTES
    // section, address.sun_path might not always be null-terminated; therefore,
    // we calculate the length based of addrlen
    const size_t src_len =
      strnlen (src_pos, _addrlen - offsetof (sockaddr_un, sun_path)
                          - (src_pos - _address.sun_path));
    memcpy (pos, src_pos, src_len);
    addr_.assign (buf, pos - buf + src_len);
    return 0;
}